

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O2

int Msat_SolverSimplifyDB(Msat_Solver_t *p)

{
  Msat_ClauseVec_t *p_00;
  int Num;
  int iVar1;
  uint uVar2;
  int iVar3;
  Msat_Clause_t *pMVar4;
  int *pAssigns;
  Msat_Clause_t **ppMVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int local_54;
  
  iVar1 = Msat_SolverReadDecisionLevel(p);
  if (iVar1 == 0) {
    pMVar4 = Msat_SolverPropagate(p);
    iVar1 = 0;
    if (pMVar4 == (Msat_Clause_t *)0x0) {
      pAssigns = Msat_SolverReadAssignsArray(p);
      iVar1 = 1;
      Num = 0;
      for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
        p_00 = (&p->vClauses)[iVar7 != 0];
        uVar2 = Msat_ClauseVecReadSize(p_00);
        ppMVar5 = Msat_ClauseVecReadArray(p_00);
        uVar9 = 0;
        uVar8 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar8 = uVar9;
        }
        local_54 = 0;
        for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          iVar3 = Msat_ClauseSimplify(ppMVar5[uVar9],pAssigns);
          pMVar4 = ppMVar5[uVar9];
          if (iVar3 == 0) {
            lVar6 = (long)local_54;
            local_54 = local_54 + 1;
            ppMVar5[lVar6] = pMVar4;
            Msat_ClauseSetNum(pMVar4,Num);
            Num = Num + 1;
          }
          else {
            Msat_ClauseFree(p,pMVar4,1);
          }
        }
        Msat_ClauseVecShrink(p_00,local_54);
      }
      p->nClauses = Num;
    }
    return iVar1;
  }
  __assert_fail("Msat_SolverReadDecisionLevel(p) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverSearch.c"
                ,0x122,"int Msat_SolverSimplifyDB(Msat_Solver_t *)");
}

Assistant:

int  Msat_SolverSimplifyDB( Msat_Solver_t * p )
{
    Msat_ClauseVec_t * vClauses;
    Msat_Clause_t ** pClauses;
    int nClauses, Type, i, j;
    int * pAssigns;
    int Counter;

    assert( Msat_SolverReadDecisionLevel(p) == 0 );
    if ( Msat_SolverPropagate(p) != NULL )
        return 0;
//Msat_SolverPrintClauses( p );
//Msat_SolverPrintAssignment( p );
//printf( "Simplification\n" );

    // simplify and reassign clause numbers
    Counter = 0;
    pAssigns = Msat_SolverReadAssignsArray( p );
    for ( Type = 0; Type < 2; Type++ )
    {
        vClauses = Type? p->vLearned : p->vClauses;
        nClauses = Msat_ClauseVecReadSize( vClauses );
        pClauses = Msat_ClauseVecReadArray( vClauses );
        for ( i = j = 0; i < nClauses; i++ )
            if ( Msat_ClauseSimplify( pClauses[i], pAssigns ) )
                Msat_ClauseFree( p, pClauses[i], 1 );
            else
            {
                pClauses[j++] = pClauses[i];
                Msat_ClauseSetNum( pClauses[i], Counter++ );
            }
        Msat_ClauseVecShrink( vClauses, j );
    }
    p->nClauses = Counter;
    return 1;
}